

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

string_view anon_unknown.dwarf_d52e3c::JsonTypeToString(ValueType type)

{
  optional<(anonymous_namespace)::Args> errorPath;
  size_t sVar1;
  json_error *this;
  char *pcVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  string_view sVar3;
  undefined8 local_38;
  undefined8 uStack_30;
  uint7 uStack_27;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  switch(type) {
  case nullValue:
    pcVar2 = "NULL";
    sVar1 = 4;
    goto LAB_002d895b;
  case intValue:
  case uintValue:
  case realValue:
    pcVar2 = "NUMBER";
    break;
  case stringValue:
    pcVar2 = "STRING";
    break;
  case booleanValue:
    pcVar2 = "BOOLEAN";
    sVar1 = 7;
    goto LAB_002d895b;
  case arrayValue:
    pcVar2 = "ARRAY";
    sVar1 = 5;
    goto LAB_002d895b;
  case objectValue:
    pcVar2 = "OBJECT";
    break;
  default:
    this = (json_error *)__cxa_allocate_exception(0x28);
    local_20._M_len = 0x17;
    local_20._M_str = "invalid JSON type found";
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current =
         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )uStack_30;
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current =
         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )local_38;
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = (ulong)uStack_27 << 8;
    message._M_len = 1;
    message._M_array = &local_20;
    json_error::json_error(this,message,errorPath);
    __cxa_throw(this,&(anonymous_namespace)::json_error::typeinfo,std::runtime_error::~runtime_error
               );
  }
  sVar1 = 6;
LAB_002d895b:
  sVar3._M_str = pcVar2;
  sVar3._M_len = sVar1;
  return sVar3;
}

Assistant:

cm::string_view JsonTypeToString(Json::ValueType type)
{
  switch (type) {
    case Json::ValueType::nullValue:
      return "NULL"_s;
    case Json::ValueType::intValue:
    case Json::ValueType::uintValue:
    case Json::ValueType::realValue:
      return "NUMBER"_s;
    case Json::ValueType::stringValue:
      return "STRING"_s;
    case Json::ValueType::booleanValue:
      return "BOOLEAN"_s;
    case Json::ValueType::arrayValue:
      return "ARRAY"_s;
    case Json::ValueType::objectValue:
      return "OBJECT"_s;
  }
  throw json_error({ "invalid JSON type found"_s });
}